

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateLoadConstantLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  WeightParamType WVar2;
  int iVar3;
  Type *pTVar4;
  iterator iVar5;
  mapped_type_conflict1 *pmVar6;
  LoadConstantLayerParams *this_00;
  uint64 uVar7;
  int i;
  int index;
  WeightParams *pWVar8;
  string *psVar9;
  uint64_t expectedUnits;
  allocator local_c2;
  allocator local_c1;
  string err_1;
  string err;
  Result r;
  string local_50;
  
  Result::Result(&r);
  validateInputCount((Result *)&err_1,layer,0,0);
  Result::operator=(&r,(Result *)&err_1);
  std::__cxx11::string::~string((string *)&err_1._M_string_length);
  bVar1 = Result::good(&r);
  if (bVar1) {
    validateOutputCount((Result *)&err_1,layer,1,1);
    Result::operator=(&r,(Result *)&err_1);
    std::__cxx11::string::~string((string *)&err_1._M_string_length);
  }
  bVar1 = Result::good(&r);
  if (bVar1) {
    if (this->ndArrayInterpretation == true) {
      pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(layer->output_).super_RepeatedPtrFieldBase,0);
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&(this->blobNameToRank)._M_t,pTVar4);
      if ((_Rb_tree_header *)iVar5._M_node !=
          &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header) {
        pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&(layer->output_).super_RepeatedPtrFieldBase,0);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::at(&this->blobNameToRank,pTVar4);
        iVar3 = *pmVar6;
        std::__cxx11::string::string((string *)&err,"LoadConstant",&local_c1);
        std::__cxx11::string::string((string *)&local_50,"output",&local_c2);
        checkRank((Result *)&err_1,layer,&err,5,5,&local_50,iVar3);
        Result::operator=(&r,(Result *)&err_1);
        std::__cxx11::string::~string((string *)&err_1._M_string_length);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&err);
        bVar1 = Result::good(&r);
        if (!bVar1) goto LAB_00592f7e;
      }
    }
    this_00 = Specification::NeuralNetworkLayer::loadconstant(layer);
    pWVar8 = this_00->data_;
    if (pWVar8 == (WeightParams *)0x0) {
      pWVar8 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    WVar2 = valueType(pWVar8);
    if (WVar2 == UNSPECIFIED) {
      std::operator+(&err_1,"Load constant layer \'",(layer->name_).ptr_);
      std::operator+(&err,&err_1,
                     "\' has both full precision and half precision weight fields populated");
      std::__cxx11::string::~string((string *)&err_1);
      Result::Result((Result *)&err_1,INVALID_MODEL_PARAMETERS,&err);
      Result::operator=(&r,(Result *)&err_1);
      std::__cxx11::string::~string((string *)&err_1._M_string_length);
      Result::Result(__return_storage_ptr__,&r);
      psVar9 = &err;
    }
    else {
      if ((this_00->shape_).current_size_ == 3) {
        expectedUnits = 1;
        iVar3 = 3;
        for (index = 0; index < iVar3; index = index + 1) {
          uVar7 = Specification::LoadConstantLayerParams::shape(this_00,index);
          expectedUnits = expectedUnits * uVar7;
          iVar3 = (this_00->shape_).current_size_;
        }
        if (iVar3 == 3) {
          uVar7 = Specification::LoadConstantLayerParams::shape(this_00,0);
          if (uVar7 < 2) goto LAB_00592ed0;
          pWVar8 = this_00->data_;
          if (pWVar8 == (WeightParams *)0x0) {
            pWVar8 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          uVar7 = Specification::LoadConstantLayerParams::shape(this_00,0);
          std::__cxx11::string::string((string *)&err,"LoadConstant",&local_c1);
          psVar9 = (layer->name_).ptr_;
          std::__cxx11::string::string((string *)&local_50,"constants",&local_c2);
          validateGeneralWeightParams
                    ((Result *)&err_1,pWVar8,expectedUnits,uVar7,&err,psVar9,&local_50);
        }
        else {
LAB_00592ed0:
          pWVar8 = this_00->data_;
          if (pWVar8 == (WeightParams *)0x0) {
            pWVar8 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          std::__cxx11::string::string((string *)&err,"LoadConstant",&local_c1);
          psVar9 = (layer->name_).ptr_;
          std::__cxx11::string::string((string *)&local_50,"constants",&local_c2);
          validateGeneralWeightParams((Result *)&err_1,pWVar8,expectedUnits,1,&err,psVar9,&local_50)
          ;
        }
        Result::operator=(&r,(Result *)&err_1);
        std::__cxx11::string::~string((string *)&err_1._M_string_length);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&err);
        bVar1 = Result::good(&r);
        if (bVar1) {
          Result::Result(__return_storage_ptr__);
          goto LAB_00592f8b;
        }
        goto LAB_00592f7e;
      }
      std::operator+(&err,"Load constant layer \'",(layer->name_).ptr_);
      std::operator+(&err_1,&err,"\' must be a 3D constant.");
      std::__cxx11::string::~string((string *)&err);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err_1);
      psVar9 = &err_1;
    }
    std::__cxx11::string::~string((string *)psVar9);
  }
  else {
LAB_00592f7e:
    Result::Result(__return_storage_ptr__,&r);
  }
LAB_00592f8b:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateLoadConstantLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 0, 0);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    if (!r.good()) {
        return r;
    }

    if (ndArrayInterpretation) {
        if (blobNameToRank.find(layer.output(0)) != blobNameToRank.end()) {
            int rank = blobNameToRank.at(layer.output(0));
            r = checkRank(layer, "LoadConstant", 5, 5, "output", rank);
            if (!r.good()) {return r;}
        }
    }

    const auto& params = layer.loadconstant();
    WeightParamType paramType = valueType(params.data());

    // Only float32 or float16 parameters can be populated at any time
    if (paramType == UNSPECIFIED) {
        std::string err = "Load constant layer '" + layer.name() + "' has both full precision and half precision weight fields populated";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    if (params.shape_size() != 3) {
        std::string err = "Load constant layer '" + layer.name() + "' must be a 3D constant.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    size_t total_shape = 1;
    for (int i = 0; i < params.shape_size(); i++) {
        total_shape *= params.shape(i);
    }
    if (params.shape_size() == 3 && params.shape(0) > 1){
        r = validateGeneralWeightParams(params.data(), total_shape, params.shape(0), "LoadConstant", layer.name(), "constants");
    } else {
        r = validateGeneralWeightParams(params.data(), total_shape, 1, "LoadConstant", layer.name(), "constants");
    }

    if (!r.good()) return r;

    return Result();
}